

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

bool slang::ast::Lookup::findTempVar
               (Scope *scope,TempVarSymbol *symbol,NameSyntax *syntax,LookupResult *result)

{
  char *pcVar1;
  NameComponents name;
  void *__s2;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  not_null<const_slang::ast::Scope_*> __n;
  bool bVar2;
  SyntaxKind SVar3;
  int iVar4;
  int colonParts;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int local_204;
  Scope *local_200;
  underlying_type local_1f0;
  Symbol *pSStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  AssertionInstanceDetails *local_1d0;
  underlying_type local_1c8;
  Symbol *pSStack_1c0;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  AssertionInstanceDetails *local_1a8;
  ASTContext local_1a0;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> local_168 [3];
  
  local_204 = 0;
  pcVar1 = local_168[0].firstElement;
  local_168[0].len = 0;
  local_168[0].cap = 4;
  SVar3 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  local_168[0].data_ = (pointer)pcVar1;
  if (SVar3 == ScopedName) {
    syntax = anon_unknown_39::splitScopedName((ScopedNameSyntax *)syntax,local_168,&local_204);
    if (local_204 == 0) {
      SVar3 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
      goto LAB_0032e135;
    }
  }
  else {
LAB_0032e135:
    if ((SVar3 - IdentifierName < 2) || (SVar3 == ClassName)) {
      anon_unknown_39::NameComponents::NameComponents((NameComponents *)&local_1a0,syntax);
      __n.ptr = local_1a0.scope.ptr;
      __s2 = (void *)CONCAT44(local_1a0._12_4_,local_1a0.lookupIndex);
      local_1c8 = local_1a0.flags.m_bits;
      pSStack_1c0 = local_1a0.instanceOrProc;
      local_1b8 = local_1a0.firstTempVar._0_4_;
      uStack_1b4 = local_1a0.firstTempVar._4_4_;
      uStack_1b0 = local_1a0.randomizeDetails._0_4_;
      uStack_1ac = local_1a0.randomizeDetails._4_4_;
      local_1a8 = local_1a0.assertionInstance;
      do {
        if ((Scope *)(symbol->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len ==
            __n.ptr) {
          if (__n.ptr != (Scope *)0x0) {
            iVar4 = bcmp((symbol->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str,
                         __s2,(size_t)__n.ptr);
            if (iVar4 != 0) goto LAB_0032e1b7;
          }
          result->found = (Symbol *)symbol;
          goto LAB_0032e1d3;
        }
LAB_0032e1b7:
        symbol = symbol->nextTemp;
      } while (symbol != (TempVarSymbol *)0x0);
      if (result->found != (Symbol *)0x0) {
LAB_0032e1d3:
        local_1a0.lookupIndex = 0xffffffff;
        local_1a0.flags.m_bits = 0;
        local_1a0.instanceOrProc = (Symbol *)0x0;
        local_1a0.firstTempVar = (TempVarSymbol *)0x0;
        local_1a0.randomizeDetails = (RandomizeDetails *)0x0;
        local_1a0.assertionInstance = (AssertionInstanceDetails *)0x0;
        nameParts_00._M_extent._M_extent_value = local_168[0].len;
        nameParts_00._M_ptr = local_168[0].data_;
        local_200 = __n.ptr;
        local_1e0 = CONCAT44(uStack_1b4,local_1b8);
        uStack_1d8 = CONCAT44(uStack_1ac,uStack_1b0);
        local_1f0 = local_1c8;
        pSStack_1e8 = pSStack_1c0;
        local_1d0 = local_1a8;
        name.text._M_str = (char *)__s2;
        name.text._M_len = (size_t)__n.ptr;
        name.range.startLoc = (SourceLocation)local_1c8;
        name.range.endLoc = (SourceLocation)pSStack_1c0;
        name.selectors._M_ptr = (pointer)local_1e0;
        name.selectors._M_extent._M_extent_value = uStack_1d8;
        name.paramAssignments = (ParameterValueAssignmentSyntax *)local_1a8;
        local_1a0.scope.ptr = scope;
        bVar2 = anon_unknown_39::lookupDownward
                          (nameParts_00,name,&local_1a0,(bitmask<slang::ast::LookupFlags>)0x0,result
                          );
        goto LAB_0032e26c;
      }
    }
  }
  bVar2 = false;
LAB_0032e26c:
  if (local_168[0].data_ != (pointer)pcVar1) {
    operator_delete(local_168[0].data_);
  }
  return bVar2;
}

Assistant:

bool Lookup::findTempVar(const Scope& scope, const TempVarSymbol& symbol, const NameSyntax& syntax,
                         LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName) {
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);
        if (colonParts)
            return false;
    }

    NameComponents name;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = *first;
            break;
        default:
            return false;
    }

    const TempVarSymbol* curr = &symbol;
    do {
        if (curr->name == name.text) {
            result.found = curr;
            break;
        }
        curr = curr->nextTemp;
    } while (curr);

    if (!result.found)
        return false;

    ASTContext context(scope, LookupLocation::max);
    return lookupDownward(nameParts, name, context, LookupFlags::None, result);
}